

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDockAreaLayoutItem * __thiscall
QDockAreaLayoutItem::operator=(QDockAreaLayoutItem *this,QDockAreaLayoutItem *other)

{
  QDockAreaLayoutInfo *pQVar1;
  QPlaceHolderItem *pQVar2;
  int iVar3;
  QDockAreaLayoutInfo *this_00;
  QPlaceHolderItem *this_01;
  
  if (this != other) {
    this->widgetItem = other->widgetItem;
    pQVar1 = this->subinfo;
    if (pQVar1 != (QDockAreaLayoutInfo *)0x0) {
      QDockAreaLayoutInfo::~QDockAreaLayoutInfo(pQVar1);
    }
    operator_delete(pQVar1,0x70);
    pQVar1 = other->subinfo;
    if (pQVar1 == (QDockAreaLayoutInfo *)0x0) {
      this_00 = (QDockAreaLayoutInfo *)0x0;
    }
    else {
      this_00 = (QDockAreaLayoutInfo *)operator_new(0x70);
      QDockAreaLayoutInfo::QDockAreaLayoutInfo(this_00,pQVar1);
    }
    this->subinfo = this_00;
    pQVar2 = this->placeHolderItem;
    if (pQVar2 != (QPlaceHolderItem *)0x0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar2);
    }
    operator_delete(pQVar2,0x30);
    pQVar2 = other->placeHolderItem;
    if (pQVar2 == (QPlaceHolderItem *)0x0) {
      this_01 = (QPlaceHolderItem *)0x0;
    }
    else {
      this_01 = (QPlaceHolderItem *)operator_new(0x30);
      QPlaceHolderItem::QPlaceHolderItem(this_01,pQVar2);
    }
    this->placeHolderItem = this_01;
    iVar3 = other->size;
    this->pos = other->pos;
    this->size = iVar3;
    this->flags = other->flags;
  }
  return this;
}

Assistant:

QDockAreaLayoutItem
    &QDockAreaLayoutItem::operator = (const QDockAreaLayoutItem &other)
{
    if (this == &other)
        return *this;

    widgetItem = other.widgetItem;
    delete subinfo;
    if (other.subinfo == nullptr)
        subinfo = nullptr;
    else
        subinfo = new QDockAreaLayoutInfo(*other.subinfo);

    delete placeHolderItem;
    if (other.placeHolderItem == nullptr)
        placeHolderItem = nullptr;
    else
        placeHolderItem = new QPlaceHolderItem(*other.placeHolderItem);

    pos = other.pos;
    size = other.size;
    flags = other.flags;

    return *this;
}